

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

void VP8LBitsEntropyUnrefined(uint32_t *array,int n,VP8LBitEntropy *entropy)

{
  uint uVar1;
  uint64_t uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  entropy->max_val = 0;
  entropy->nonzero_code = 0xffff;
  entropy->sum = 0;
  entropy->nonzeros = 0;
  if (n < 1) {
    uVar5 = 0;
    lVar3 = 0;
  }
  else {
    uVar7 = 0;
    lVar3 = 0;
    iVar6 = 0;
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar1 = array[uVar4];
      if ((ulong)uVar1 != 0) {
        uVar5 = uVar5 + uVar1;
        entropy->sum = uVar5;
        entropy->nonzero_code = (uint32_t)uVar4;
        iVar6 = iVar6 + 1;
        entropy->nonzeros = iVar6;
        if (uVar1 < 0x100) {
          uVar2 = kSLog2Table[uVar1];
        }
        else {
          uVar2 = (*VP8LFastSLog2Slow)(uVar1);
        }
        lVar3 = lVar3 + uVar2;
        if (uVar7 < uVar1) {
          entropy->max_val = uVar1;
          uVar7 = uVar1;
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
    if (0xff < uVar5) {
      uVar2 = (*VP8LFastSLog2Slow)(uVar5);
      goto LAB_00143513;
    }
  }
  uVar2 = kSLog2Table[uVar5];
LAB_00143513:
  entropy->entropy = uVar2 - lVar3;
  return;
}

Assistant:

void VP8LBitsEntropyUnrefined(const uint32_t* WEBP_RESTRICT const array, int n,
                              VP8LBitEntropy* WEBP_RESTRICT const entropy) {
  int i;

  VP8LBitEntropyInit(entropy);

  for (i = 0; i < n; ++i) {
    if (array[i] != 0) {
      entropy->sum += array[i];
      entropy->nonzero_code = i;
      ++entropy->nonzeros;
      entropy->entropy += VP8LFastSLog2(array[i]);
      if (entropy->max_val < array[i]) {
        entropy->max_val = array[i];
      }
    }
  }
  entropy->entropy = VP8LFastSLog2(entropy->sum) - entropy->entropy;
}